

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

void __thiscall wasm::PassRunner::addDefaultGlobalOptimizationPostPasses(PassRunner *this)

{
  bool bVar1;
  string *this_00;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  allocator<char> local_11;
  
  if ((1 < (this->options).optimizeLevel) || (0 < (this->options).shrinkLevel)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"dae-optimizing",&local_11);
    addIfNoDWARFIssues(this,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    if ((1 < (this->options).optimizeLevel) || (1 < (this->options).shrinkLevel)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"inlining-optimizing",&local_11);
      addIfNoDWARFIssues(this,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"duplicate-function-elimination",&local_11);
  addIfNoDWARFIssues(this,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"duplicate-import-elimination",&local_11);
  addIfNoDWARFIssues(this,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  if ((this->options).shrinkLevel < 2) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"merge-similar-functions",&local_11);
    addIfNoDWARFIssues(this,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    bVar1 = 1 < (this->options).shrinkLevel;
  }
  if ((1 < (this->options).optimizeLevel) || (bVar1)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"simplify-globals-optimizing",&local_11);
    addIfNoDWARFIssues(this,&local_d8);
    this_00 = &local_d8;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"simplify-globals",&local_11);
    addIfNoDWARFIssues(this,&local_b8);
    this_00 = &local_b8;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"remove-unused-module-elements",&local_11);
  addIfNoDWARFIssues(this,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  if ((this->options).optimizeLevel < 2) {
    bVar1 = false;
LAB_00954fa2:
    if ((!bVar1) && ((this->options).shrinkLevel < 1)) goto LAB_00954fd5;
  }
  else if (((this->wasm->features).features & 0x4000) != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"string-gathering",&local_11);
    addIfNoDWARFIssues(this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    bVar1 = 1 < (this->options).optimizeLevel;
    goto LAB_00954fa2;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"reorder-globals",&local_11);
  addIfNoDWARFIssues(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
LAB_00954fd5:
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"directize",&local_11);
  addIfNoDWARFIssues(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void PassRunner::addDefaultGlobalOptimizationPostPasses() {
  if (options.optimizeLevel >= 2 || options.shrinkLevel >= 1) {
    addIfNoDWARFIssues("dae-optimizing");
  }
  if (options.optimizeLevel >= 2 || options.shrinkLevel >= 2) {
    addIfNoDWARFIssues("inlining-optimizing");
  }

  // Optimizations show more functions as duplicate, so run this here in Post.
  addIfNoDWARFIssues("duplicate-function-elimination");
  addIfNoDWARFIssues("duplicate-import-elimination");

  // perform after the number of functions is reduced by inlining-optimizing
  if (options.shrinkLevel >= 2) {
    addIfNoDWARFIssues("merge-similar-functions");
  }

  if (options.optimizeLevel >= 2 || options.shrinkLevel >= 2) {
    addIfNoDWARFIssues("simplify-globals-optimizing");
  } else {
    addIfNoDWARFIssues("simplify-globals");
  }
  addIfNoDWARFIssues("remove-unused-module-elements");
  if (options.optimizeLevel >= 2 && wasm->features.hasStrings()) {
    // Gather strings to globals right before reorder-globals, which will then
    // sort them properly.
    addIfNoDWARFIssues("string-gathering");
  }
  if (options.optimizeLevel >= 2 || options.shrinkLevel >= 1) {
    addIfNoDWARFIssues("reorder-globals");
  }
  // may allow more inlining/dae/etc., need --converge for that
  addIfNoDWARFIssues("directize");
}